

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall
MPLSStreamInfo::composeStreamEntry
          (MPLSStreamInfo *this,BitStreamWriter *writer,size_t entryNum,int subPathID)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  undefined4 *puVar7;
  uint value;
  uint num;
  int local_1e0;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream ss;
  
  puVar3 = (writer->super_BitStream).m_buffer;
  puVar4 = (writer->super_BitStream).m_initBuffer;
  uVar1 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,8,0);
  puVar5 = (writer->super_BitStream).m_buffer;
  puVar6 = (writer->super_BitStream).m_initBuffer;
  uVar2 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,8,(uint)this->type);
  switch(this->type) {
  case '\x01':
    value = (this->super_M2TSStreamInfo).streamPID;
    num = 0x10;
    break;
  case '\x02':
    BitStreamWriter::putBits(writer,8,0);
    BitStreamWriter::putBits(writer,8,0);
    BitStreamWriter::putBits(writer,0x10,(this->super_M2TSStreamInfo).streamPID);
    num = 0x20;
    goto LAB_001e9a90;
  case '\x03':
    num = 8;
    BitStreamWriter::putBits(writer,8,subPathID);
    value = (this->super_M2TSStreamInfo).streamPID;
    break;
  case '\x04':
    num = 8;
    BitStreamWriter::putBits(writer,8,0);
    BitStreamWriter::putBits(writer,0x10,(this->super_M2TSStreamInfo).streamPID);
    BitStreamWriter::putBits(writer,0x20,0);
    goto LAB_001e9a90;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    std::operator<<((ostream *)&ss,"Unsupported media type for AVCHD/Blu-ray muxing");
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar7 = 3;
    *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
    if (local_1c8 == &local_1b8) {
      puVar7[6] = local_1b8;
      puVar7[7] = uStack_1b4;
      puVar7[8] = uStack_1b0;
      puVar7[9] = uStack_1ac;
    }
    else {
      *(uint **)(puVar7 + 2) = local_1c8;
      *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1b4,local_1b8);
    }
    *(undefined8 *)(puVar7 + 4) = local_1c0;
    local_1b8 = local_1b8 & 0xffffff00;
    __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  BitStreamWriter::putBits(writer,0x10,value);
  BitStreamWriter::putBits(writer,0x20,0);
LAB_001e9a90:
  BitStreamWriter::putBits(writer,num,0);
  local_1e0 = (int)puVar6;
  *(char *)((long)puVar4 + (long)((int)(uVar1 + ((int)puVar3 - (int)puVar4) * 8) / 8)) =
       (char)((int)((*(int *)&(writer->super_BitStream).m_buffer -
                    *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited) / 8)
       + (char)((int)(uVar2 + ((int)puVar5 - local_1e0) * 8) / -8);
  return;
}

Assistant:

void MPLSStreamInfo::composeStreamEntry(BitStreamWriter& writer, size_t entryNum, const int subPathID) const
{
    uint8_t* lengthPos = writer.getBuffer() + writer.getBitsCount() / 8;
    writer.putBits(8, 0);  // length
    const int initPos = writer.getBitsCount() / 8;
    writer.putBits(8, type);
    if (type == 1)
    {
        writer.putBits(16, streamPID);
        writer.putBits(32, 0);
        writer.putBits(16, 0);
    }
    else if (type == 2)
    {
        writer.putBits(8, 0);  // ref_to_SubPath_id
        writer.putBits(8, 0);  // entryNum - ref_to_subClip_entry_id
        writer.putBits(16, streamPID);
        writer.putBits(32, 0);
    }
    else if (type == 3)
    {
        writer.putBits(8, subPathID);  // ref_to_SubPath_id. constant subPathID == 0
        writer.putBits(16, streamPID);
        writer.putBits(32, 0);
        writer.putBits(8, 0);
    }
    else if (type == 4)
    {
        writer.putBits(8, 0);
        writer.putBits(16, streamPID);
        writer.putBits(32, 0);
        writer.putBits(8, 0);
    }
    else
        THROW(ERR_COMMON, "Unsupported media type for AVCHD/Blu-ray muxing")
    *lengthPos = static_cast<uint8_t>(writer.getBitsCount() / 8 - initPos);
}